

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O0

void __thiscall vkt::memory::anon_unknown_0::State::State(State *this,Usage usage,deUint32 seed)

{
  VkPipelineStageFlags allowedStages;
  VkAccessFlags allowedAccesses;
  deUint32 seed_local;
  Usage usage_local;
  State *this_local;
  
  this->stage = STAGE_HOST;
  allowedStages = usageToStageFlags(usage);
  allowedAccesses = usageToAccessFlags(usage);
  CacheState::CacheState(&this->cache,allowedStages,allowedAccesses);
  de::Random::Random(&this->rng,seed);
  this->mapped = false;
  this->hostInvalidated = true;
  this->hostFlushed = true;
  this->memoryDefined = false;
  this->hasBuffer = false;
  this->hasBoundBufferMemory = false;
  this->hasImage = false;
  this->hasBoundImageMemory = false;
  this->imageLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  this->imageDefined = false;
  this->queueIdle = true;
  this->deviceIdle = true;
  this->commandBufferIsEmpty = true;
  this->renderPassIsEmpty = true;
  return;
}

Assistant:

State (Usage usage, deUint32 seed)
		: stage					(STAGE_HOST)
		, cache					(usageToStageFlags(usage), usageToAccessFlags(usage))
		, rng					(seed)
		, mapped				(false)
		, hostInvalidated		(true)
		, hostFlushed			(true)
		, memoryDefined			(false)
		, hasBuffer				(false)
		, hasBoundBufferMemory	(false)
		, hasImage				(false)
		, hasBoundImageMemory	(false)
		, imageLayout			(vk::VK_IMAGE_LAYOUT_UNDEFINED)
		, imageDefined			(false)
		, queueIdle				(true)
		, deviceIdle			(true)
		, commandBufferIsEmpty	(true)
		, renderPassIsEmpty		(true)
	{
	}